

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_logger.h
# Opt level: O0

void cfd::core::logger::log<void_const*&>
               (CfdSourceLocation *source,CfdLogLevel lvl,char *fmt,void **args)

{
  ulong uVar1;
  undefined8 in_RCX;
  CfdLogLevel in_ESI;
  CfdSourceLocation *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> message;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_void_*>
  *vargs;
  char **in_stack_ffffffffffffff28;
  string local_b8 [32];
  undefined8 local_98;
  undefined1 local_90 [12];
  CfdLogLevel local_84;
  CfdSourceLocation *local_80;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  local_78;
  basic_string_view<char> local_68;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  local_58;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_48;
  undefined8 local_40;
  undefined1 *local_38;
  string *local_30;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_28;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_20;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_18;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_10;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_8;
  
  local_98 = in_RCX;
  local_84 = in_ESI;
  local_80 = in_RDI;
  uVar1 = cfd::core::logger::IsEnableLogLevel(in_ESI);
  if ((uVar1 & 1) != 0) {
    local_38 = local_90;
    local_40 = local_98;
    local_30 = local_b8;
    local_58.named_args.data =
         (named_arg_info<char> *)
         ::fmt::v7::make_args_checked<void_const*&,char_const*,char>
                   (in_stack_ffffffffffffff28,(remove_reference_t<const_void_*&> *)0x3e854d);
    local_48 = &local_58;
    local_68 = ::fmt::v7::to_string_view<char,_0>((char *)0x3e857d);
    local_20 = &local_78;
    local_28 = local_48;
    local_18 = local_48;
    local_8 = local_48;
    local_10 = local_20;
    ::fmt::v7::
    basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    ::basic_format_args(local_20,0xe,
                        (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                         *)&local_48->string);
    ::fmt::v7::detail::vformat_abi_cxx11_
              (local_b8,local_68.data_,local_68.size_,local_78.desc_,local_78.field_1.values_);
    cfd::core::logger::WriteLog(local_80,local_84,local_b8);
    std::__cxx11::string::~string(local_b8);
  }
  return;
}

Assistant:

void log(
    const CfdSourceLocation &source, cfd::core::logger::CfdLogLevel lvl,
    const char *fmt, Args &&...args) {
  if (cfd::core::logger::IsEnableLogLevel(lvl)) {
    auto message = fmt::format(fmt, args...);
    // std::string message = fmt::format(std::locale::messages, fmt, args...);
    cfd::core::logger::WriteLog(source, lvl, message);
  }
}